

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

int __thiscall TPZFBMatrix<std::complex<float>_>::Zero(TPZFBMatrix<std::complex<float>_> *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (this->fElem).fNElements;
  if (lVar1 != 0) {
    lVar2 = 0;
    do {
      (this->fElem).fStore[lVar2]._M_value = 0;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

inline int64_t size() const { return fNElements; }